

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerHLSL::emit_hlsl_entry_point(CompilerHLSL *this)

{
  ParsedIR *this_00;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ExecutionModel EVar4;
  size_t sVar5;
  Variant *pVVar6;
  Parameter *pPVar7;
  undefined1 auVar8 [16];
  char cVar9;
  char cVar10;
  bool bVar11;
  bool bVar12;
  uint uVar13;
  SPIREntryPoint *pSVar14;
  const_iterator cVar15;
  long *plVar16;
  SPIRConstant *pSVar17;
  SPIREntryPoint *pSVar18;
  SPIRVariable *pSVar19;
  SPIRType *pSVar20;
  SPIRFunction *pSVar21;
  runtime_error *prVar22;
  uint uVar23;
  size_type *psVar24;
  char *pcVar25;
  int iVar26;
  long lVar27;
  _Hash_node_base *p_Var28;
  uint32_t __val;
  TypedID<(spirv_cross::Types)0> *pTVar29;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar30;
  Parameter *pPVar31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar32;
  pointer pcVar33;
  TypedID<(spirv_cross::Types)0> *pTVar34;
  uint32_t uVar35;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  long lVar36;
  _Alloc_hider _Var37;
  uint32_t i;
  uint32_t __val_00;
  ulong uVar38;
  bool legacy;
  string z_expr;
  SpecializationConstant wg_x;
  uint local_1390;
  undefined1 local_1388 [16];
  SpecializationConstant wg_y;
  SpecializationConstant wg_z;
  string y_expr;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  arguments;
  string x_expr;
  
  arguments.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &arguments.stack_storage;
  arguments.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .buffer_size = 0;
  arguments.buffer_capacity = 8;
  if (this->require_input == true) {
    x_expr._M_dataplus._M_p = (pointer)&x_expr.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&x_expr,"SPIRV_Cross_Input stage_input","");
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&arguments,&x_expr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)x_expr._M_dataplus._M_p != &x_expr.field_2) {
      operator_delete(x_expr._M_dataplus._M_p);
    }
  }
  pSVar14 = Compiler::get_entry_point((Compiler *)this);
  EVar4 = pSVar14->model;
  if ((int)EVar4 < 0x14f4) {
    if (EVar4 == ExecutionModelFragment) {
      if (((pSVar14->flags).lower & 0x200) != 0) {
        CompilerGLSL::statement<char_const(&)[20]>
                  (&this->super_CompilerGLSL,(char (*) [20])"[earlydepthstencil]");
      }
      goto LAB_00267e0d;
    }
    if (EVar4 != ExecutionModelGLCompute) goto LAB_00267e0d;
  }
  else if (EVar4 != ExecutionModelTaskEXT) {
    if (EVar4 != ExecutionModelMeshEXT) goto LAB_00267e0d;
    x_expr._M_dataplus._M_p._0_4_ = 0x14b2;
    this_01 = &(pSVar14->flags).higher;
    cVar15 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::find(&this_01->_M_h,(key_type *)&x_expr);
    if (cVar15.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
      x_expr._M_dataplus._M_p._0_4_ = 0x1495;
      cVar15 = ::std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::find(&this_01->_M_h,(key_type *)&x_expr);
      if (cVar15.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
        if (((pSVar14->flags).lower & 0x8000000) != 0) {
          prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
          x_expr._M_dataplus._M_p = (pointer)&x_expr.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&x_expr,"Topology mode \"points\" is not supported in DirectX","");
          ::std::runtime_error::runtime_error(prVar22,(string *)&x_expr);
          *(undefined ***)prVar22 = &PTR__runtime_error_003f8e68;
          __cxa_throw(prVar22,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      else {
        CompilerGLSL::statement<char_const(&)[25]>
                  (&this->super_CompilerGLSL,(char (*) [25])"[outputtopology(\"line\")]");
      }
    }
    else {
      CompilerGLSL::statement<char_const(&)[29]>
                (&this->super_CompilerGLSL,(char (*) [29])"[outputtopology(\"triangle\")]");
    }
    pSVar21 = Variant::get<spirv_cross::SPIRFunction>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr +
                         (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
    sVar5 = (pSVar21->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
    if (sVar5 != 0) {
      pPVar31 = (pSVar21->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
      pPVar7 = pPVar31 + sVar5;
      paVar2 = &y_expr.field_2;
      paVar3 = &x_expr.field_2;
      do {
        pSVar19 = Variant::get<spirv_cross::SPIRVariable>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr + (pPVar31->id).id);
        pSVar20 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr +
                             *(uint *)&(pSVar19->super_IVariant).field_0xc);
        bVar11 = Compiler::has_decoration
                           ((Compiler *)this,(ID)(pSVar20->super_IVariant).self.id,DecorationBlock);
        if (pSVar19->storage == StorageClassTaskPayloadWorkgroupEXT) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])(&y_expr,this,pSVar19);
          plVar16 = (long *)::std::__cxx11::string::replace((ulong)&y_expr,0,(char *)0x0,0x3664a4);
          psVar24 = (size_type *)(plVar16 + 2);
          if ((size_type *)*plVar16 == psVar24) {
            x_expr.field_2._M_allocated_capacity = *psVar24;
            x_expr.field_2._8_8_ = plVar16[3];
            x_expr._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            x_expr.field_2._M_allocated_capacity = *psVar24;
            x_expr._M_dataplus._M_p = (pointer)*plVar16;
          }
          x_expr._M_string_length = plVar16[1];
          *plVar16 = (long)psVar24;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&arguments,&x_expr);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)x_expr._M_dataplus._M_p != paVar3) {
            operator_delete(x_expr._M_dataplus._M_p);
          }
          _Var37._M_p = y_expr._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)y_expr._M_dataplus._M_p != paVar2) goto LAB_0026791b;
          goto LAB_00267a69;
        }
        if (bVar11) {
          Compiler::get_buffer_block_flags
                    ((Bitset *)&x_expr,(Compiler *)this,
                     (VariableID)(pSVar19->super_IVariant).self.id);
          auVar8._8_8_ = 0;
          auVar8._0_8_ = x_expr.field_2._M_allocated_capacity;
          uVar38 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1497)) % auVar8,0);
          plVar16 = *(long **)(x_expr._M_string_length + (uVar38 & 0xffffffff) * 8);
          if (plVar16 != (long *)0x0) {
            plVar16 = (long *)*plVar16;
            uVar13 = *(uint *)(plVar16 + 1);
            do {
              if (uVar13 == 0x1497) goto LAB_00267420;
              plVar16 = (long *)*plVar16;
            } while ((plVar16 != (long *)0x0) &&
                    (uVar13 = *(uint *)(plVar16 + 1),
                    (ulong)uVar13 % x_expr.field_2._M_allocated_capacity == uVar38));
          }
          bVar11 = Compiler::has_decoration
                             ((Compiler *)this,(ID)(pPVar31->id).id,DecorationPerPrimitiveEXT);
          if (bVar11) {
LAB_00267420:
            uVar13 = pSVar14->output_primitives;
            cVar10 = '\x01';
            if (9 < uVar13) {
              uVar23 = uVar13;
              cVar9 = '\x04';
              do {
                cVar10 = cVar9;
                if (uVar23 < 100) {
                  cVar10 = cVar10 + -2;
                  goto LAB_00267564;
                }
                if (uVar23 < 1000) {
                  cVar10 = cVar10 + -1;
                  goto LAB_00267564;
                }
                if (uVar23 < 10000) goto LAB_00267564;
                bVar11 = 99999 < uVar23;
                uVar23 = uVar23 / 10000;
                cVar9 = cVar10 + '\x04';
              } while (bVar11);
              cVar10 = cVar10 + '\x01';
            }
LAB_00267564:
            wg_x = (SpecializationConstant)local_1388;
            ::std::__cxx11::string::_M_construct((ulong)&wg_x,cVar10);
            ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)wg_x,local_1390,uVar13);
            plVar16 = (long *)::std::__cxx11::string::replace((ulong)&wg_x,0,(char *)0x0,0x3664b0);
            z_expr._M_dataplus._M_p = (pointer)&z_expr.field_2;
            psVar24 = (size_type *)(plVar16 + 2);
            if ((size_type *)*plVar16 == psVar24) {
              z_expr.field_2._M_allocated_capacity = *psVar24;
              z_expr.field_2._8_8_ = plVar16[3];
            }
            else {
              z_expr.field_2._M_allocated_capacity = *psVar24;
              z_expr._M_dataplus._M_p = (pointer)*plVar16;
            }
            z_expr._M_string_length = plVar16[1];
            *plVar16 = (long)psVar24;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            plVar16 = (long *)::std::__cxx11::string::append((char *)&z_expr);
            psVar24 = (size_type *)(plVar16 + 2);
            if ((size_type *)*plVar16 == psVar24) {
              y_expr.field_2._M_allocated_capacity = *psVar24;
              y_expr.field_2._8_8_ = plVar16[3];
              y_expr._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              y_expr.field_2._M_allocated_capacity = *psVar24;
              y_expr._M_dataplus._M_p = (pointer)*plVar16;
            }
            y_expr._M_string_length = plVar16[1];
            *plVar16 = (long)psVar24;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back(&arguments,&y_expr);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)y_expr._M_dataplus._M_p != paVar2) {
              operator_delete(y_expr._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)z_expr._M_dataplus._M_p != &z_expr.field_2) {
              operator_delete(z_expr._M_dataplus._M_p);
            }
            if (wg_x != (SpecializationConstant)local_1388) {
LAB_00267a57:
              operator_delete((void *)wg_x);
            }
          }
          else {
            uVar13 = pSVar14->output_vertices;
            cVar10 = '\x01';
            if (9 < uVar13) {
              uVar23 = uVar13;
              cVar9 = '\x04';
              do {
                cVar10 = cVar9;
                if (uVar23 < 100) {
                  cVar10 = cVar10 + -2;
                  goto LAB_0026792c;
                }
                if (uVar23 < 1000) {
                  cVar10 = cVar10 + -1;
                  goto LAB_0026792c;
                }
                if (uVar23 < 10000) goto LAB_0026792c;
                bVar11 = 99999 < uVar23;
                uVar23 = uVar23 / 10000;
                cVar9 = cVar10 + '\x04';
              } while (bVar11);
              cVar10 = cVar10 + '\x01';
            }
LAB_0026792c:
            wg_x = (SpecializationConstant)local_1388;
            ::std::__cxx11::string::_M_construct((ulong)&wg_x,cVar10);
            ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)wg_x,local_1390,uVar13);
            plVar16 = (long *)::std::__cxx11::string::replace((ulong)&wg_x,0,(char *)0x0,0x3664ec);
            z_expr._M_dataplus._M_p = (pointer)&z_expr.field_2;
            psVar24 = (size_type *)(plVar16 + 2);
            if ((size_type *)*plVar16 == psVar24) {
              z_expr.field_2._M_allocated_capacity = *psVar24;
              z_expr.field_2._8_8_ = plVar16[3];
            }
            else {
              z_expr.field_2._M_allocated_capacity = *psVar24;
              z_expr._M_dataplus._M_p = (pointer)*plVar16;
            }
            z_expr._M_string_length = plVar16[1];
            *plVar16 = (long)psVar24;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            plVar16 = (long *)::std::__cxx11::string::append((char *)&z_expr);
            psVar24 = (size_type *)(plVar16 + 2);
            if ((size_type *)*plVar16 == psVar24) {
              y_expr.field_2._M_allocated_capacity = *psVar24;
              y_expr.field_2._8_8_ = plVar16[3];
              y_expr._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              y_expr.field_2._M_allocated_capacity = *psVar24;
              y_expr._M_dataplus._M_p = (pointer)*plVar16;
            }
            y_expr._M_string_length = plVar16[1];
            *plVar16 = (long)psVar24;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back(&arguments,&y_expr);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)y_expr._M_dataplus._M_p != paVar2) {
              operator_delete(y_expr._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)z_expr._M_dataplus._M_p != &z_expr.field_2) {
              operator_delete(z_expr._M_dataplus._M_p);
            }
            if (wg_x != (SpecializationConstant)local_1388) goto LAB_00267a57;
          }
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)&x_expr._M_string_length);
        }
        else {
          x_expr._M_dataplus._M_p._0_4_ = 0x14b2;
          cVar15 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(&this_01->_M_h,(key_type *)&x_expr);
          z_expr._M_dataplus._M_p = (pointer)&z_expr.field_2;
          if (cVar15.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
            uVar13 = pSVar14->output_primitives;
            cVar10 = '\x01';
            if (9 < uVar13) {
              uVar23 = uVar13;
              cVar9 = '\x04';
              do {
                cVar10 = cVar9;
                if (uVar23 < 100) {
                  cVar10 = cVar10 + -2;
                  goto LAB_002677e3;
                }
                if (uVar23 < 1000) {
                  cVar10 = cVar10 + -1;
                  goto LAB_002677e3;
                }
                if (uVar23 < 10000) goto LAB_002677e3;
                bVar11 = 99999 < uVar23;
                uVar23 = uVar23 / 10000;
                cVar9 = cVar10 + '\x04';
              } while (bVar11);
              cVar10 = cVar10 + '\x01';
            }
LAB_002677e3:
            ::std::__cxx11::string::_M_construct((ulong)&z_expr,cVar10);
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      (z_expr._M_dataplus._M_p,(uint)z_expr._M_string_length,uVar13);
            plVar16 = (long *)::std::__cxx11::string::replace((ulong)&z_expr,0,(char *)0x0,0x366553)
            ;
            psVar24 = (size_type *)(plVar16 + 2);
            if ((size_type *)*plVar16 == psVar24) {
              y_expr.field_2._M_allocated_capacity = *psVar24;
              y_expr.field_2._8_8_ = plVar16[3];
              y_expr._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              y_expr.field_2._M_allocated_capacity = *psVar24;
              y_expr._M_dataplus._M_p = (pointer)*plVar16;
            }
            y_expr._M_string_length = plVar16[1];
            *plVar16 = (long)psVar24;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            plVar16 = (long *)::std::__cxx11::string::append((char *)&y_expr);
            psVar24 = (size_type *)(plVar16 + 2);
            if ((size_type *)*plVar16 == psVar24) {
              x_expr.field_2._M_allocated_capacity = *psVar24;
              x_expr.field_2._8_8_ = plVar16[3];
              x_expr._M_dataplus._M_p = (pointer)paVar3;
            }
            else {
              x_expr.field_2._M_allocated_capacity = *psVar24;
              x_expr._M_dataplus._M_p = (pointer)*plVar16;
            }
            x_expr._M_string_length = plVar16[1];
            *plVar16 = (long)psVar24;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back(&arguments,&x_expr);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)x_expr._M_dataplus._M_p != paVar3) {
              operator_delete(x_expr._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)y_expr._M_dataplus._M_p != paVar2) {
              operator_delete(y_expr._M_dataplus._M_p);
            }
            _Var37._M_p = z_expr._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)z_expr._M_dataplus._M_p != &z_expr.field_2) goto LAB_0026791b;
          }
          else {
            uVar13 = pSVar14->output_primitives;
            cVar10 = '\x01';
            if (9 < uVar13) {
              uVar23 = uVar13;
              cVar9 = '\x04';
              do {
                cVar10 = cVar9;
                if (uVar23 < 100) {
                  cVar10 = cVar10 + -2;
                  goto LAB_0026769f;
                }
                if (uVar23 < 1000) {
                  cVar10 = cVar10 + -1;
                  goto LAB_0026769f;
                }
                if (uVar23 < 10000) goto LAB_0026769f;
                bVar11 = 99999 < uVar23;
                uVar23 = uVar23 / 10000;
                cVar9 = cVar10 + '\x04';
              } while (bVar11);
              cVar10 = cVar10 + '\x01';
            }
LAB_0026769f:
            ::std::__cxx11::string::_M_construct((ulong)&z_expr,cVar10);
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      (z_expr._M_dataplus._M_p,(uint)z_expr._M_string_length,uVar13);
            plVar16 = (long *)::std::__cxx11::string::replace((ulong)&z_expr,0,(char *)0x0,0x366521)
            ;
            psVar24 = (size_type *)(plVar16 + 2);
            if ((size_type *)*plVar16 == psVar24) {
              y_expr.field_2._M_allocated_capacity = *psVar24;
              y_expr.field_2._8_8_ = plVar16[3];
              y_expr._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              y_expr.field_2._M_allocated_capacity = *psVar24;
              y_expr._M_dataplus._M_p = (pointer)*plVar16;
            }
            y_expr._M_string_length = plVar16[1];
            *plVar16 = (long)psVar24;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            plVar16 = (long *)::std::__cxx11::string::append((char *)&y_expr);
            psVar24 = (size_type *)(plVar16 + 2);
            if ((size_type *)*plVar16 == psVar24) {
              x_expr.field_2._M_allocated_capacity = *psVar24;
              x_expr.field_2._8_8_ = plVar16[3];
              x_expr._M_dataplus._M_p = (pointer)paVar3;
            }
            else {
              x_expr.field_2._M_allocated_capacity = *psVar24;
              x_expr._M_dataplus._M_p = (pointer)*plVar16;
            }
            x_expr._M_string_length = plVar16[1];
            *plVar16 = (long)psVar24;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back(&arguments,&x_expr);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)x_expr._M_dataplus._M_p != paVar3) {
              operator_delete(x_expr._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)y_expr._M_dataplus._M_p != paVar2) {
              operator_delete(y_expr._M_dataplus._M_p);
            }
            _Var37._M_p = z_expr._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)z_expr._M_dataplus._M_p != &z_expr.field_2) {
LAB_0026791b:
              operator_delete(_Var37._M_p);
            }
          }
        }
LAB_00267a69:
        pPVar31 = pPVar31 + 1;
      } while (pPVar31 != pPVar7);
    }
  }
  wg_x = (SpecializationConstant)((ulong)wg_x & 0xffffffff00000000);
  wg_y.id.id = 0;
  wg_z = (SpecializationConstant)((ulong)wg_z & 0xffffffff00000000);
  Compiler::get_work_group_size_specialization_constants((Compiler *)this,&wg_x,&wg_y,&wg_z);
  uVar35 = (pSVar14->workgroup_size).x;
  __val_00 = (pSVar14->workgroup_size).y;
  __val = (pSVar14->workgroup_size).z;
  if (((pSVar14->workgroup_size).constant == 0) && (((pSVar14->flags).lower & 0x4000000000) != 0)) {
    uVar38 = (ulong)(pSVar14->workgroup_size).id_x;
    if (uVar38 != 0) {
      pSVar17 = Variant::get<spirv_cross::SPIRConstant>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + uVar38);
      uVar35 = (pSVar17->m).c[0].r[0].u32;
    }
    uVar38 = (ulong)(pSVar14->workgroup_size).id_y;
    if (uVar38 != 0) {
      pSVar17 = Variant::get<spirv_cross::SPIRConstant>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + uVar38);
      __val_00 = (pSVar17->m).c[0].r[0].u32;
    }
    uVar38 = (ulong)(pSVar14->workgroup_size).id_z;
    if (uVar38 != 0) {
      pSVar17 = Variant::get<spirv_cross::SPIRConstant>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + uVar38);
      __val = (pSVar17->m).c[0].r[0].u32;
    }
  }
  if (((ulong)wg_x & 0xffffffff) == 0) {
    cVar10 = '\x01';
    if (9 < uVar35) {
      uVar38 = (ulong)uVar35;
      cVar9 = '\x04';
      do {
        cVar10 = cVar9;
        uVar13 = (uint)uVar38;
        if (uVar13 < 100) {
          cVar10 = cVar10 + -2;
          goto LAB_00267bd0;
        }
        if (uVar13 < 1000) {
          cVar10 = cVar10 + -1;
          goto LAB_00267bd0;
        }
        if (uVar13 < 10000) goto LAB_00267bd0;
        uVar38 = uVar38 / 10000;
        cVar9 = cVar10 + '\x04';
      } while (99999 < uVar13);
      cVar10 = cVar10 + '\x01';
    }
LAB_00267bd0:
    x_expr._M_dataplus._M_p = (pointer)&x_expr.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&x_expr,cVar10);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (x_expr._M_dataplus._M_p,(uint)x_expr._M_string_length,uVar35);
  }
  else {
    pSVar17 = Variant::get<spirv_cross::SPIRConstant>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + ((ulong)wg_x & 0xffffffff));
    x_expr._M_dataplus._M_p = (pointer)&x_expr.field_2;
    pcVar33 = (pSVar17->specialization_constant_macro_name)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&x_expr,pcVar33,
               pcVar33 + (pSVar17->specialization_constant_macro_name)._M_string_length);
  }
  if ((ulong)wg_y.id.id == 0) {
    cVar10 = '\x01';
    if (9 < __val_00) {
      uVar13 = __val_00;
      cVar9 = '\x04';
      do {
        cVar10 = cVar9;
        if (uVar13 < 100) {
          cVar10 = cVar10 + -2;
          goto LAB_00267ca2;
        }
        if (uVar13 < 1000) {
          cVar10 = cVar10 + -1;
          goto LAB_00267ca2;
        }
        if (uVar13 < 10000) goto LAB_00267ca2;
        bVar11 = 99999 < uVar13;
        uVar13 = uVar13 / 10000;
        cVar9 = cVar10 + '\x04';
      } while (bVar11);
      cVar10 = cVar10 + '\x01';
    }
LAB_00267ca2:
    y_expr._M_dataplus._M_p = (pointer)&y_expr.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&y_expr,cVar10);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (y_expr._M_dataplus._M_p,(uint)y_expr._M_string_length,__val_00);
  }
  else {
    pSVar17 = Variant::get<spirv_cross::SPIRConstant>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + wg_y.id.id);
    y_expr._M_dataplus._M_p = (pointer)&y_expr.field_2;
    pcVar33 = (pSVar17->specialization_constant_macro_name)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&y_expr,pcVar33,
               pcVar33 + (pSVar17->specialization_constant_macro_name)._M_string_length);
  }
  if (((ulong)wg_z & 0xffffffff) == 0) {
    cVar10 = '\x01';
    if (9 < __val) {
      uVar38 = (ulong)__val;
      cVar9 = '\x04';
      do {
        cVar10 = cVar9;
        uVar13 = (uint)uVar38;
        if (uVar13 < 100) {
          cVar10 = cVar10 + -2;
          goto LAB_00267d69;
        }
        if (uVar13 < 1000) {
          cVar10 = cVar10 + -1;
          goto LAB_00267d69;
        }
        if (uVar13 < 10000) goto LAB_00267d69;
        uVar38 = uVar38 / 10000;
        cVar9 = cVar10 + '\x04';
      } while (99999 < uVar13);
      cVar10 = cVar10 + '\x01';
    }
LAB_00267d69:
    z_expr._M_dataplus._M_p = (pointer)&z_expr.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&z_expr,cVar10);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (z_expr._M_dataplus._M_p,(uint)z_expr._M_string_length,__val);
  }
  else {
    pSVar17 = Variant::get<spirv_cross::SPIRConstant>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + ((ulong)wg_z & 0xffffffff));
    z_expr._M_dataplus._M_p = (pointer)&z_expr.field_2;
    pcVar33 = (pSVar17->specialization_constant_macro_name)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&z_expr,pcVar33,
               pcVar33 + (pSVar17->specialization_constant_macro_name)._M_string_length);
  }
  CompilerGLSL::
  statement<char_const(&)[13],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
            (&this->super_CompilerGLSL,(char (*) [13])"[numthreads(",&x_expr,(char (*) [3])0x376a17,
             &y_expr,(char (*) [3])0x376a17,&z_expr,(char (*) [3])0x366455);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)z_expr._M_dataplus._M_p != &z_expr.field_2) {
    operator_delete(z_expr._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)y_expr._M_dataplus._M_p != &y_expr.field_2) {
    operator_delete(y_expr._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)x_expr._M_dataplus._M_p != &x_expr.field_2) {
    operator_delete(x_expr._M_dataplus._M_p);
  }
LAB_00267e0d:
  if ((this->hlsl_options).use_entry_point_name == true) {
    pSVar18 = Compiler::get_entry_point((Compiler *)this);
    wg_z = (SpecializationConstant)(pSVar18->name)._M_dataplus._M_p;
  }
  else {
    wg_z = (SpecializationConstant)((long)"frag_main" + 5);
  }
  pcVar25 = "void ";
  if (this->require_output != false) {
    pcVar25 = "SPIRV_Cross_Output ";
  }
  x_expr.field_2._M_allocated_capacity = 0;
  x_expr._M_dataplus._M_p = (pointer)0x0;
  x_expr._M_string_length = 0;
  z_expr._M_dataplus._M_p = pcVar25;
  StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)&x_expr);
  if (arguments.
      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .buffer_size != 0) {
    pbVar32 = arguments.
              super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .ptr + arguments.
                     super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .buffer_size;
    pbVar30 = arguments.
              super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .ptr;
    do {
      StringStream<4096UL,_4096UL>::append
                ((StringStream<4096UL,_4096UL> *)&x_expr,(pbVar30->_M_dataplus)._M_p,
                 pbVar30->_M_string_length);
      if (pbVar30 !=
          arguments.
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .ptr + (arguments.
                  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .buffer_size - 1)) {
        StringStream<4096UL,_4096UL>::append((StringStream<4096UL,_4096UL> *)&x_expr,", ",2);
      }
      pbVar30 = pbVar30 + 1;
    } while (pbVar30 != pbVar32);
  }
  StringStream<4096ul,4096ul>::str_abi_cxx11_(&y_expr,&x_expr);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)&x_expr);
  pcVar25 = (char *)&y_expr;
  CompilerGLSL::
  statement<char_const*,char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
            (&this->super_CompilerGLSL,(char **)&z_expr,(char **)&wg_z,(char (*) [2])0x379f10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar25,
             (char (*) [2])0x3623fe);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)y_expr._M_dataplus._M_p != &y_expr.field_2) {
    operator_delete(y_expr._M_dataplus._M_p);
  }
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  legacy = (this->hlsl_options).shader_model < 0x1f;
  y_expr._M_string_length = (size_type)&legacy;
  uVar38 = 0;
  y_expr._M_dataplus._M_p = (pointer)this;
  do {
    if (((this->super_CompilerGLSL).super_Compiler.active_input_builtins.lower >> (uVar38 & 0x3f) &
        1) != 0) {
      emit_hlsl_entry_point::anon_class_16_2_46e5c3c4::operator()
                ((anon_class_16_2_46e5c3c4 *)&y_expr,(uint32_t)uVar38);
    }
    uVar38 = uVar38 + 1;
  } while (uVar38 != 0x40);
  sVar5 = (this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h.
          _M_element_count;
  if (sVar5 != 0) {
    pcVar33 = (pointer)((long)&x_expr.field_2 + 8);
    x_expr._M_string_length = 0;
    x_expr.field_2._M_allocated_capacity = 8;
    x_expr._M_dataplus._M_p = pcVar33;
    SmallVector<unsigned_int,_8UL>::reserve((SmallVector<unsigned_int,_8UL> *)&x_expr,sVar5);
    p_Var28 = (this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h.
              _M_before_begin._M_nxt;
    if (p_Var28 != (_Hash_node_base *)0x0) {
      do {
        SmallVector<unsigned_int,_8UL>::reserve
                  ((SmallVector<unsigned_int,_8UL> *)&x_expr,x_expr._M_string_length + 1);
        *(undefined4 *)(x_expr._M_dataplus._M_p + x_expr._M_string_length * 4) =
             *(undefined4 *)&p_Var28[1]._M_nxt;
        x_expr._M_string_length = x_expr._M_string_length + 1;
        p_Var28 = p_Var28->_M_nxt;
      } while (p_Var28 != (_Hash_node_base *)0x0);
    }
    _Var37._M_p = x_expr._M_dataplus._M_p;
    if (x_expr._M_string_length != 0) {
      pcVar1 = x_expr._M_dataplus._M_p + x_expr._M_string_length * 4;
      lVar27 = 0x3f;
      if (x_expr._M_string_length != 0) {
        for (; x_expr._M_string_length >> lVar27 == 0; lVar27 = lVar27 + -1) {
        }
      }
      ::std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (x_expr._M_dataplus._M_p,pcVar1,((uint)lVar27 ^ 0x3f) * 2 ^ 0x7e);
      ::std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
                (_Var37._M_p,pcVar1);
      _Var37 = x_expr._M_dataplus;
      if (x_expr._M_string_length != 0) {
        lVar27 = x_expr._M_string_length << 2;
        lVar36 = 0;
        do {
          emit_hlsl_entry_point::anon_class_16_2_46e5c3c4::operator()
                    ((anon_class_16_2_46e5c3c4 *)&y_expr,*(uint32_t *)(_Var37._M_p + lVar36));
          lVar36 = lVar36 + 4;
        } while (lVar27 != lVar36);
      }
    }
    x_expr._M_string_length = 0;
    if (x_expr._M_dataplus._M_p != pcVar33) {
      free(x_expr._M_dataplus._M_p);
    }
  }
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(this_00);
  sVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar5 != 0) {
    pTVar29 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    pTVar34 = pTVar29 + sVar5;
    do {
      pVVar6 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar6[pTVar29->id].type == TypeVariable) {
        pSVar19 = Variant::get<spirv_cross::SPIRVariable>(pVVar6 + pTVar29->id);
        pSVar20 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr +
                             *(uint *)&(pSVar19->super_IVariant).field_0xc);
        bVar11 = Compiler::has_decoration
                           ((Compiler *)this,(ID)(pSVar20->super_IVariant).self.id,DecorationBlock);
        if (((pSVar19->storage == StorageClassInput) && (pSVar19->remapped_variable == false)) &&
           (pSVar20->pointer == true)) {
          EVar4 = pSVar14->model;
          bVar12 = Compiler::is_builtin_variable((Compiler *)this,pSVar19);
          if ((!bVar12) &&
             (bVar12 = Compiler::interface_variable_exists_in_entry_point
                                 ((Compiler *)this,(pSVar19->super_IVariant).self.id), bVar12)) {
            if (bVar11) {
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (&x_expr,this,(ulong)(pSVar20->super_IVariant).self.id,1);
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (&y_expr,this,(ulong)(pSVar19->super_IVariant).self.id,1);
              if ((int)(pSVar20->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size !=
                  0) {
                uVar35 = 0;
                do {
                  CompilerGLSL::to_member_name_abi_cxx11_
                            (&z_expr,&this->super_CompilerGLSL,pSVar20,uVar35);
                  join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                            ((string *)&wg_x,(spirv_cross *)&x_expr,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x366a8c,(char (*) [2])&z_expr,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pcVar25);
                  pcVar25 = " = stage_input.";
                  CompilerGLSL::
                  statement<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[16],std::__cxx11::string&,char_const(&)[2]>
                            (&this->super_CompilerGLSL,&y_expr,(char (*) [2])0x36210b,&z_expr,
                             (char (*) [16])0x368cb4,(string *)&wg_x,(char (*) [2])0x361554);
                  if (wg_x != (SpecializationConstant)local_1388) {
                    operator_delete((void *)wg_x);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)z_expr._M_dataplus._M_p != &z_expr.field_2) {
                    operator_delete(z_expr._M_dataplus._M_p);
                  }
                  uVar35 = uVar35 + 1;
                } while (uVar35 < (uint)(pSVar20->member_types).
                                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                        .buffer_size);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)y_expr._M_dataplus._M_p != &y_expr.field_2) {
                operator_delete(y_expr._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)x_expr._M_dataplus._M_p != &x_expr.field_2) {
LAB_002683c7:
                operator_delete(x_expr._M_dataplus._M_p);
              }
            }
            else {
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (&x_expr,this,(ulong)(pSVar19->super_IVariant).self.id,1);
              pSVar20 = Variant::get<spirv_cross::SPIRType>
                                  ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr +
                                   *(uint *)&(pSVar19->super_IVariant).field_0xc);
              if ((EVar4 == ExecutionModelVertex) && (1 < pSVar20->columns)) {
                y_expr._M_dataplus._M_p = y_expr._M_dataplus._M_p & 0xffffffff00000000;
                do {
                  pcVar25 = "] = stage_input.";
                  CompilerGLSL::
                  statement<std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[17],std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                            (&this->super_CompilerGLSL,&x_expr,(char (*) [2])0x366551,
                             (uint *)&y_expr,(char (*) [17])"] = stage_input.",&x_expr,
                             (char (*) [2])0x366a8c,(uint *)&y_expr,(char (*) [2])0x361554);
                  uVar13 = (uint)y_expr._M_dataplus._M_p + 1;
                  y_expr._M_dataplus._M_p._0_4_ = uVar13;
                } while (uVar13 < pSVar20->columns);
              }
              else {
                pcVar25 = ";";
                CompilerGLSL::
                statement<std::__cxx11::string&,char_const(&)[16],std::__cxx11::string&,char_const(&)[2]>
                          (&this->super_CompilerGLSL,&x_expr,(char (*) [16])0x368cb4,&x_expr,
                           (char (*) [2])0x361554);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)x_expr._M_dataplus._M_p != &x_expr.field_2) goto LAB_002683c7;
            }
          }
        }
      }
      pTVar29 = pTVar29 + 1;
    } while (pTVar29 != pTVar34);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&wg_y);
  EVar4 = pSVar14->model;
  if (((ExecutionModelGLCompute < EVar4) || ((0x31U >> (EVar4 & 0x1f) & 1) == 0)) &&
     (1 < EVar4 - ExecutionModelTaskEXT)) {
    prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
    x_expr._M_dataplus._M_p = (pointer)&x_expr.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&x_expr,"Unsupported shader stage.","");
    ::std::runtime_error::runtime_error(prVar22,(string *)&x_expr);
    *(undefined ***)prVar22 = &PTR__runtime_error_003f8e68;
    __cxa_throw(prVar22,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  y_expr._M_dataplus._M_p = (pointer)((long)&y_expr.field_2 + 8);
  y_expr._M_string_length = 0;
  y_expr.field_2._M_allocated_capacity = 8;
  pSVar21 = Variant::get<spirv_cross::SPIRFunction>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr +
                       (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  sVar5 = (pSVar21->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
  if (sVar5 != 0) {
    pPVar7 = (pSVar21->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
    lVar27 = 0;
    do {
      CompilerGLSL::to_expression_abi_cxx11_
                (&x_expr,&this->super_CompilerGLSL,*(uint32_t *)((long)&(pPVar7->id).id + lVar27),
                 false);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)&y_expr,&x_expr);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)x_expr._M_dataplus._M_p != &x_expr.field_2) {
        operator_delete(x_expr._M_dataplus._M_p);
      }
      lVar27 = lVar27 + 0x14;
    } while (sVar5 * 0x14 != lVar27);
  }
  get_inner_entry_point_name_abi_cxx11_(&z_expr,this);
  x_expr.field_2._M_allocated_capacity = 0;
  x_expr._M_dataplus._M_p = (pointer)0x0;
  x_expr._M_string_length = 0;
  StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)&x_expr);
  if (y_expr._M_string_length != 0) {
    pcVar33 = y_expr._M_dataplus._M_p + y_expr._M_string_length * 0x20;
    _Var37 = y_expr._M_dataplus;
    do {
      StringStream<4096UL,_4096UL>::append
                ((StringStream<4096UL,_4096UL> *)&x_expr,*(char **)_Var37._M_p,
                 *(size_t *)(_Var37._M_p + 8));
      if (_Var37._M_p != y_expr._M_dataplus._M_p + y_expr._M_string_length * 0x20 + -0x20) {
        StringStream<4096UL,_4096UL>::append((StringStream<4096UL,_4096UL> *)&x_expr,", ",2);
      }
      _Var37._M_p = _Var37._M_p + 0x20;
    } while (_Var37._M_p != pcVar33);
  }
  StringStream<4096ul,4096ul>::str_abi_cxx11_((string *)&wg_x,&x_expr);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)&x_expr);
  pbVar30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x361553;
  CompilerGLSL::
  statement<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3]>
            (&this->super_CompilerGLSL,&z_expr,(char (*) [2])0x379f10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x,
             (char (*) [3])0x361553);
  if (wg_x != (SpecializationConstant)local_1388) {
    operator_delete((void *)wg_x);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)z_expr._M_dataplus._M_p != &z_expr.field_2) {
    operator_delete(z_expr._M_dataplus._M_p);
  }
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                  *)&y_expr);
  if (this->require_output != false) {
    CompilerGLSL::statement<char_const(&)[33]>
              (&this->super_CompilerGLSL,(char (*) [33])"SPIRV_Cross_Output stage_output;");
    uVar38 = 0;
    do {
      if (((this->super_CompilerGLSL).super_Compiler.active_output_builtins.lower >> (uVar38 & 0x3f)
          & 1) != 0) {
        emit_hlsl_entry_point::anon_class_16_2_1de67c4e::operator()
                  ((anon_class_16_2_1de67c4e *)&legacy,(uint32_t)this);
      }
      uVar38 = uVar38 + 1;
    } while (uVar38 != 0x40);
    sVar5 = (this->super_CompilerGLSL).super_Compiler.active_output_builtins.higher._M_h.
            _M_element_count;
    if (sVar5 != 0) {
      pcVar33 = (pointer)((long)&x_expr.field_2 + 8);
      x_expr._M_string_length = 0;
      x_expr.field_2._M_allocated_capacity = 8;
      x_expr._M_dataplus._M_p = pcVar33;
      SmallVector<unsigned_int,_8UL>::reserve((SmallVector<unsigned_int,_8UL> *)&x_expr,sVar5);
      p_Var28 = (this->super_CompilerGLSL).super_Compiler.active_output_builtins.higher._M_h.
                _M_before_begin._M_nxt;
      if (p_Var28 != (_Hash_node_base *)0x0) {
        do {
          SmallVector<unsigned_int,_8UL>::reserve
                    ((SmallVector<unsigned_int,_8UL> *)&x_expr,x_expr._M_string_length + 1);
          *(undefined4 *)(x_expr._M_dataplus._M_p + x_expr._M_string_length * 4) =
               *(undefined4 *)&p_Var28[1]._M_nxt;
          x_expr._M_string_length = x_expr._M_string_length + 1;
          p_Var28 = p_Var28->_M_nxt;
        } while (p_Var28 != (_Hash_node_base *)0x0);
      }
      _Var37._M_p = x_expr._M_dataplus._M_p;
      if (x_expr._M_string_length != 0) {
        pcVar1 = x_expr._M_dataplus._M_p + x_expr._M_string_length * 4;
        lVar27 = 0x3f;
        if (x_expr._M_string_length != 0) {
          for (; x_expr._M_string_length >> lVar27 == 0; lVar27 = lVar27 + -1) {
          }
        }
        ::std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (x_expr._M_dataplus._M_p,pcVar1,((uint)lVar27 ^ 0x3f) * 2 ^ 0x7e);
        ::std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
                  (_Var37._M_p,pcVar1);
        if (x_expr._M_string_length != 0) {
          lVar27 = x_expr._M_string_length << 2;
          lVar36 = 0;
          do {
            emit_hlsl_entry_point::anon_class_16_2_1de67c4e::operator()
                      ((anon_class_16_2_1de67c4e *)&legacy,(uint32_t)this);
            lVar36 = lVar36 + 4;
          } while (lVar27 != lVar36);
        }
      }
      x_expr._M_string_length = 0;
      if (x_expr._M_dataplus._M_p != pcVar33) {
        free(x_expr._M_dataplus._M_p);
      }
    }
    ParsedIR::create_loop_hard_lock(this_00);
    sVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    if (sVar5 != 0) {
      pTVar34 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
      pTVar29 = pTVar34 + sVar5;
      do {
        pVVar6 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.ptr;
        if (pVVar6[pTVar34->id].type == TypeVariable) {
          pSVar19 = Variant::get<spirv_cross::SPIRVariable>(pVVar6 + pTVar34->id);
          pSVar20 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               *(uint *)&(pSVar19->super_IVariant).field_0xc);
          bVar11 = Compiler::has_decoration
                             ((Compiler *)this,(ID)(pSVar20->super_IVariant).self.id,DecorationBlock
                             );
          if (((pSVar19->storage == StorageClassOutput) && (pSVar19->remapped_variable == false)) &&
             ((pSVar20->pointer == true &&
              ((bVar12 = Compiler::is_builtin_variable((Compiler *)this,pSVar19), !bVar12 &&
               (bVar12 = Compiler::interface_variable_exists_in_entry_point
                                   ((Compiler *)this,(pSVar19->super_IVariant).self.id), bVar12)))))
             ) {
            if (bVar11) {
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (&x_expr,this,(ulong)(pSVar20->super_IVariant).self.id,1);
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (&y_expr,this,(ulong)(pSVar19->super_IVariant).self.id,1);
              if ((int)(pSVar20->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size !=
                  0) {
                uVar35 = 0;
                do {
                  CompilerGLSL::to_member_name_abi_cxx11_
                            (&z_expr,&this->super_CompilerGLSL,pSVar20,uVar35);
                  join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                            ((string *)&wg_x,(spirv_cross *)&x_expr,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x366a8c,(char (*) [2])&z_expr,pbVar30);
                  pbVar30 = &y_expr;
                  CompilerGLSL::
                  statement<char_const(&)[14],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                            (&this->super_CompilerGLSL,(char (*) [14])"stage_output.",
                             (string *)&wg_x,(char (*) [4])0x37984e,pbVar30,(char (*) [2])0x36210b,
                             &z_expr,(char (*) [2])0x361554);
                  if (wg_x != (SpecializationConstant)local_1388) {
                    operator_delete((void *)wg_x);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)z_expr._M_dataplus._M_p != &z_expr.field_2) {
                    operator_delete(z_expr._M_dataplus._M_p);
                  }
                  uVar35 = uVar35 + 1;
                } while (uVar35 < (uint)(pSVar20->member_types).
                                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                        .buffer_size);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)y_expr._M_dataplus._M_p != &y_expr.field_2) {
                operator_delete(y_expr._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)x_expr._M_dataplus._M_p != &x_expr.field_2) {
LAB_00268a63:
                operator_delete(x_expr._M_dataplus._M_p);
              }
            }
            else {
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (&x_expr,this,(ulong)(pSVar19->super_IVariant).self.id,1);
              if ((legacy == true) && (pSVar14->model == ExecutionModelFragment)) {
                y_expr._M_dataplus._M_p = (pointer)&y_expr.field_2;
                y_expr._M_string_length = 0;
                y_expr.field_2._M_allocated_capacity =
                     y_expr.field_2._M_allocated_capacity & 0xffffffffffffff00;
                if (pSVar20->vecsize < 4) {
                  iVar26 = pSVar20->vecsize - 4;
                  do {
                    ::std::__cxx11::string::append((char *)&y_expr);
                    iVar26 = iVar26 + 1;
                  } while (iVar26 != 0);
                }
                pbVar30 = &x_expr;
                CompilerGLSL::
                statement<char_const(&)[14],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string&,std::__cxx11::string&,char_const(&)[3]>
                          (&this->super_CompilerGLSL,(char (*) [14])"stage_output.",pbVar30,
                           (char (*) [11])" = float4(",pbVar30,&y_expr,(char (*) [3])0x361553);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)y_expr._M_dataplus._M_p != &y_expr.field_2) {
                  operator_delete(y_expr._M_dataplus._M_p);
                }
              }
              else {
                pbVar30 = &x_expr;
                CompilerGLSL::
                statement<char_const(&)[14],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                          (&this->super_CompilerGLSL,(char (*) [14])"stage_output.",pbVar30,
                           (char (*) [4])0x37984e,pbVar30,(char (*) [2])0x361554);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)x_expr._M_dataplus._M_p != &x_expr.field_2) goto LAB_00268a63;
            }
          }
        }
        pTVar34 = pTVar34 + 1;
      } while (pTVar34 != pTVar29);
    }
    ParsedIR::LoopLock::~LoopLock((LoopLock *)&wg_y);
    CompilerGLSL::statement<char_const(&)[21]>
              (&this->super_CompilerGLSL,(char (*) [21])"return stage_output;");
  }
  CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector(&arguments);
  return;
}

Assistant:

void CompilerHLSL::emit_hlsl_entry_point()
{
	SmallVector<string> arguments;

	if (require_input)
		arguments.push_back("SPIRV_Cross_Input stage_input");

	auto &execution = get_entry_point();

	switch (execution.model)
	{
	case ExecutionModelTaskEXT:
	case ExecutionModelMeshEXT:
	case ExecutionModelGLCompute:
	{
		if (execution.model == ExecutionModelMeshEXT)
		{
			if (execution.flags.get(ExecutionModeOutputTrianglesEXT))
				statement("[outputtopology(\"triangle\")]");
			else if (execution.flags.get(ExecutionModeOutputLinesEXT))
				statement("[outputtopology(\"line\")]");
			else if (execution.flags.get(ExecutionModeOutputPoints))
				SPIRV_CROSS_THROW("Topology mode \"points\" is not supported in DirectX");

			auto &func = get<SPIRFunction>(ir.default_entry_point);
			for (auto &arg : func.arguments)
			{
				auto &var = get<SPIRVariable>(arg.id);
				auto &base_type = get<SPIRType>(var.basetype);
				bool block = has_decoration(base_type.self, DecorationBlock);
				if (var.storage == StorageClassTaskPayloadWorkgroupEXT)
				{
					arguments.push_back("in payload " + variable_decl(var));
				}
				else if (block)
				{
					auto flags = get_buffer_block_flags(var.self);
					if (flags.get(DecorationPerPrimitiveEXT) || has_decoration(arg.id, DecorationPerPrimitiveEXT))
					{
						arguments.push_back("out primitives gl_MeshPerPrimitiveEXT gl_MeshPrimitivesEXT[" +
						                    std::to_string(execution.output_primitives) + "]");
					}
					else
					{
						arguments.push_back("out vertices gl_MeshPerVertexEXT gl_MeshVerticesEXT[" +
						                    std::to_string(execution.output_vertices) + "]");
					}
				}
				else
				{
					if (execution.flags.get(ExecutionModeOutputTrianglesEXT))
					{
						arguments.push_back("out indices uint3 gl_PrimitiveTriangleIndicesEXT[" +
						                    std::to_string(execution.output_primitives) + "]");
					}
					else
					{
						arguments.push_back("out indices uint2 gl_PrimitiveLineIndicesEXT[" +
						                    std::to_string(execution.output_primitives) + "]");
					}
				}
			}
		}
		SpecializationConstant wg_x, wg_y, wg_z;
		get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

		uint32_t x = execution.workgroup_size.x;
		uint32_t y = execution.workgroup_size.y;
		uint32_t z = execution.workgroup_size.z;

		if (!execution.workgroup_size.constant && execution.flags.get(ExecutionModeLocalSizeId))
		{
			if (execution.workgroup_size.id_x)
				x = get<SPIRConstant>(execution.workgroup_size.id_x).scalar();
			if (execution.workgroup_size.id_y)
				y = get<SPIRConstant>(execution.workgroup_size.id_y).scalar();
			if (execution.workgroup_size.id_z)
				z = get<SPIRConstant>(execution.workgroup_size.id_z).scalar();
		}

		auto x_expr = wg_x.id ? get<SPIRConstant>(wg_x.id).specialization_constant_macro_name : to_string(x);
		auto y_expr = wg_y.id ? get<SPIRConstant>(wg_y.id).specialization_constant_macro_name : to_string(y);
		auto z_expr = wg_z.id ? get<SPIRConstant>(wg_z.id).specialization_constant_macro_name : to_string(z);

		statement("[numthreads(", x_expr, ", ", y_expr, ", ", z_expr, ")]");
		break;
	}
	case ExecutionModelFragment:
		if (execution.flags.get(ExecutionModeEarlyFragmentTests))
			statement("[earlydepthstencil]");
		break;
	default:
		break;
	}

	const char *entry_point_name;
	if (hlsl_options.use_entry_point_name)
		entry_point_name = get_entry_point().name.c_str();
	else
		entry_point_name = "main";

	statement(require_output ? "SPIRV_Cross_Output " : "void ", entry_point_name, "(", merge(arguments), ")");
	begin_scope();
	bool legacy = hlsl_options.shader_model <= 30;

	// Copy builtins from entry point arguments to globals.
	active_input_builtins.for_each_bit([&](uint32_t i) {
		auto builtin = builtin_to_glsl(static_cast<BuiltIn>(i), StorageClassInput);
		switch (static_cast<BuiltIn>(i))
		{
		case BuiltInFragCoord:
			// VPOS in D3D9 is sampled at integer locations, apply half-pixel offset to be consistent.
			// TODO: Do we need an option here? Any reason why a D3D9 shader would be used
			// on a D3D10+ system with a different rasterization config?
			if (legacy)
				statement(builtin, " = stage_input.", builtin, " + float4(0.5f, 0.5f, 0.0f, 0.0f);");
			else
			{
				statement(builtin, " = stage_input.", builtin, ";");
				// ZW are undefined in D3D9, only do this fixup here.
				statement(builtin, ".w = 1.0 / ", builtin, ".w;");
			}
			break;

		case BuiltInVertexId:
		case BuiltInVertexIndex:
		case BuiltInInstanceIndex:
			// D3D semantics are uint, but shader wants int.
			if (hlsl_options.support_nonzero_base_vertex_base_instance)
			{
				if (static_cast<BuiltIn>(i) == BuiltInInstanceIndex)
					statement(builtin, " = int(stage_input.", builtin, ") + SPIRV_Cross_BaseInstance;");
				else
					statement(builtin, " = int(stage_input.", builtin, ") + SPIRV_Cross_BaseVertex;");
			}
			else
				statement(builtin, " = int(stage_input.", builtin, ");");
			break;

		case BuiltInBaseVertex:
			statement(builtin, " = SPIRV_Cross_BaseVertex;");
			break;

		case BuiltInBaseInstance:
			statement(builtin, " = SPIRV_Cross_BaseInstance;");
			break;

		case BuiltInInstanceId:
			// D3D semantics are uint, but shader wants int.
			statement(builtin, " = int(stage_input.", builtin, ");");
			break;

		case BuiltInNumWorkgroups:
		case BuiltInPointCoord:
		case BuiltInSubgroupSize:
		case BuiltInSubgroupLocalInvocationId:
		case BuiltInHelperInvocation:
			break;

		case BuiltInSubgroupEqMask:
			// Emulate these ...
			// No 64-bit in HLSL, so have to do it in 32-bit and unroll.
			statement("gl_SubgroupEqMask = 1u << (WaveGetLaneIndex() - uint4(0, 32, 64, 96));");
			statement("if (WaveGetLaneIndex() >= 32) gl_SubgroupEqMask.x = 0;");
			statement("if (WaveGetLaneIndex() >= 64 || WaveGetLaneIndex() < 32) gl_SubgroupEqMask.y = 0;");
			statement("if (WaveGetLaneIndex() >= 96 || WaveGetLaneIndex() < 64) gl_SubgroupEqMask.z = 0;");
			statement("if (WaveGetLaneIndex() < 96) gl_SubgroupEqMask.w = 0;");
			break;

		case BuiltInSubgroupGeMask:
			// Emulate these ...
			// No 64-bit in HLSL, so have to do it in 32-bit and unroll.
			statement("gl_SubgroupGeMask = ~((1u << (WaveGetLaneIndex() - uint4(0, 32, 64, 96))) - 1u);");
			statement("if (WaveGetLaneIndex() >= 32) gl_SubgroupGeMask.x = 0u;");
			statement("if (WaveGetLaneIndex() >= 64) gl_SubgroupGeMask.y = 0u;");
			statement("if (WaveGetLaneIndex() >= 96) gl_SubgroupGeMask.z = 0u;");
			statement("if (WaveGetLaneIndex() < 32) gl_SubgroupGeMask.y = ~0u;");
			statement("if (WaveGetLaneIndex() < 64) gl_SubgroupGeMask.z = ~0u;");
			statement("if (WaveGetLaneIndex() < 96) gl_SubgroupGeMask.w = ~0u;");
			break;

		case BuiltInSubgroupGtMask:
			// Emulate these ...
			// No 64-bit in HLSL, so have to do it in 32-bit and unroll.
			statement("uint gt_lane_index = WaveGetLaneIndex() + 1;");
			statement("gl_SubgroupGtMask = ~((1u << (gt_lane_index - uint4(0, 32, 64, 96))) - 1u);");
			statement("if (gt_lane_index >= 32) gl_SubgroupGtMask.x = 0u;");
			statement("if (gt_lane_index >= 64) gl_SubgroupGtMask.y = 0u;");
			statement("if (gt_lane_index >= 96) gl_SubgroupGtMask.z = 0u;");
			statement("if (gt_lane_index >= 128) gl_SubgroupGtMask.w = 0u;");
			statement("if (gt_lane_index < 32) gl_SubgroupGtMask.y = ~0u;");
			statement("if (gt_lane_index < 64) gl_SubgroupGtMask.z = ~0u;");
			statement("if (gt_lane_index < 96) gl_SubgroupGtMask.w = ~0u;");
			break;

		case BuiltInSubgroupLeMask:
			// Emulate these ...
			// No 64-bit in HLSL, so have to do it in 32-bit and unroll.
			statement("uint le_lane_index = WaveGetLaneIndex() + 1;");
			statement("gl_SubgroupLeMask = (1u << (le_lane_index - uint4(0, 32, 64, 96))) - 1u;");
			statement("if (le_lane_index >= 32) gl_SubgroupLeMask.x = ~0u;");
			statement("if (le_lane_index >= 64) gl_SubgroupLeMask.y = ~0u;");
			statement("if (le_lane_index >= 96) gl_SubgroupLeMask.z = ~0u;");
			statement("if (le_lane_index >= 128) gl_SubgroupLeMask.w = ~0u;");
			statement("if (le_lane_index < 32) gl_SubgroupLeMask.y = 0u;");
			statement("if (le_lane_index < 64) gl_SubgroupLeMask.z = 0u;");
			statement("if (le_lane_index < 96) gl_SubgroupLeMask.w = 0u;");
			break;

		case BuiltInSubgroupLtMask:
			// Emulate these ...
			// No 64-bit in HLSL, so have to do it in 32-bit and unroll.
			statement("gl_SubgroupLtMask = (1u << (WaveGetLaneIndex() - uint4(0, 32, 64, 96))) - 1u;");
			statement("if (WaveGetLaneIndex() >= 32) gl_SubgroupLtMask.x = ~0u;");
			statement("if (WaveGetLaneIndex() >= 64) gl_SubgroupLtMask.y = ~0u;");
			statement("if (WaveGetLaneIndex() >= 96) gl_SubgroupLtMask.z = ~0u;");
			statement("if (WaveGetLaneIndex() < 32) gl_SubgroupLtMask.y = 0u;");
			statement("if (WaveGetLaneIndex() < 64) gl_SubgroupLtMask.z = 0u;");
			statement("if (WaveGetLaneIndex() < 96) gl_SubgroupLtMask.w = 0u;");
			break;

		case BuiltInClipDistance:
			for (uint32_t clip = 0; clip < clip_distance_count; clip++)
				statement("gl_ClipDistance[", clip, "] = stage_input.gl_ClipDistance", clip / 4, ".", "xyzw"[clip & 3],
				          ";");
			break;

		case BuiltInCullDistance:
			for (uint32_t cull = 0; cull < cull_distance_count; cull++)
				statement("gl_CullDistance[", cull, "] = stage_input.gl_CullDistance", cull / 4, ".", "xyzw"[cull & 3],
				          ";");
			break;

		default:
			statement(builtin, " = stage_input.", builtin, ";");
			break;
		}
	});

	// Copy from stage input struct to globals.
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		bool block = has_decoration(type.self, DecorationBlock);

		if (var.storage != StorageClassInput)
			return;

		bool need_matrix_unroll = var.storage == StorageClassInput && execution.model == ExecutionModelVertex;

		if (!var.remapped_variable && type.pointer && !is_builtin_variable(var) &&
		    interface_variable_exists_in_entry_point(var.self))
		{
			if (block)
			{
				auto type_name = to_name(type.self);
				auto var_name = to_name(var.self);
				for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(type.member_types.size()); mbr_idx++)
				{
					auto mbr_name = to_member_name(type, mbr_idx);
					auto flat_name = join(type_name, "_", mbr_name);
					statement(var_name, ".", mbr_name, " = stage_input.", flat_name, ";");
				}
			}
			else
			{
				auto name = to_name(var.self);
				auto &mtype = this->get<SPIRType>(var.basetype);
				if (need_matrix_unroll && mtype.columns > 1)
				{
					// Unroll matrices.
					for (uint32_t col = 0; col < mtype.columns; col++)
						statement(name, "[", col, "] = stage_input.", name, "_", col, ";");
				}
				else
				{
					statement(name, " = stage_input.", name, ";");
				}
			}
		}
	});

	// Run the shader.
	if (execution.model == ExecutionModelVertex ||
	    execution.model == ExecutionModelFragment ||
	    execution.model == ExecutionModelGLCompute ||
	    execution.model == ExecutionModelMeshEXT ||
	    execution.model == ExecutionModelTaskEXT)
	{
		// For mesh shaders, we receive special arguments that we must pass down as function arguments.
		// HLSL does not support proper reference types for passing these IO blocks,
		// but DXC post-inlining seems to magically fix it up anyways *shrug*.
		SmallVector<string> arglist;
		auto &func = get<SPIRFunction>(ir.default_entry_point);
		// The arguments are marked out, avoid detecting reads and emitting inout.
		for (auto &arg : func.arguments)
			arglist.push_back(to_expression(arg.id, false));
		statement(get_inner_entry_point_name(), "(", merge(arglist), ");");
	}
	else
		SPIRV_CROSS_THROW("Unsupported shader stage.");

	// Copy stage outputs.
	if (require_output)
	{
		statement("SPIRV_Cross_Output stage_output;");

		// Copy builtins from globals to return struct.
		active_output_builtins.for_each_bit([&](uint32_t i) {
			// PointSize doesn't exist in HLSL SM 4+.
			if (i == BuiltInPointSize && !legacy)
				return;

			switch (static_cast<BuiltIn>(i))
			{
			case BuiltInClipDistance:
				for (uint32_t clip = 0; clip < clip_distance_count; clip++)
					statement("stage_output.gl_ClipDistance", clip / 4, ".", "xyzw"[clip & 3], " = gl_ClipDistance[",
					          clip, "];");
				break;

			case BuiltInCullDistance:
				for (uint32_t cull = 0; cull < cull_distance_count; cull++)
					statement("stage_output.gl_CullDistance", cull / 4, ".", "xyzw"[cull & 3], " = gl_CullDistance[",
					          cull, "];");
				break;

			default:
			{
				auto builtin_expr = builtin_to_glsl(static_cast<BuiltIn>(i), StorageClassOutput);
				statement("stage_output.", builtin_expr, " = ", builtin_expr, ";");
				break;
			}
			}
		});

		ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
			auto &type = this->get<SPIRType>(var.basetype);
			bool block = has_decoration(type.self, DecorationBlock);

			if (var.storage != StorageClassOutput)
				return;

			if (!var.remapped_variable && type.pointer &&
			    !is_builtin_variable(var) &&
			    interface_variable_exists_in_entry_point(var.self))
			{
				if (block)
				{
					// I/O blocks need to flatten output.
					auto type_name = to_name(type.self);
					auto var_name = to_name(var.self);
					for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(type.member_types.size()); mbr_idx++)
					{
						auto mbr_name = to_member_name(type, mbr_idx);
						auto flat_name = join(type_name, "_", mbr_name);
						statement("stage_output.", flat_name, " = ", var_name, ".", mbr_name, ";");
					}
				}
				else
				{
					auto name = to_name(var.self);

					if (legacy && execution.model == ExecutionModelFragment)
					{
						string output_filler;
						for (uint32_t size = type.vecsize; size < 4; ++size)
							output_filler += ", 0.0";

						statement("stage_output.", name, " = float4(", name, output_filler, ");");
					}
					else
					{
						statement("stage_output.", name, " = ", name, ";");
					}
				}
			}
		});

		statement("return stage_output;");
	}

	end_scope();
}